

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void openjtalk_initialize_sub_cold_1(void)

{
  fprintf(_stderr,"%s\n",anon_var_dwarf_92c);
  return;
}

Assistant:

void console_message(const char *mes)
{
#if defined(_WIN32)
	char *temp = u8tosjis(mes);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	fprintf(stderr, temp);
	free(temp);
#else
	fprintf(stderr, "%s\n", mes);
#endif
}